

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

bool __thiscall crnlib::crn_comp::compress_internal(crn_comp *this)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  uint *p;
  void *pvVar4;
  uchar *puVar5;
  crn_progress_callback_func p_Var6;
  bool bVar7;
  crn_bool cVar8;
  vector<unsigned_short> *pAlpha_endpoint_remap;
  ulong uVar9;
  vector<unsigned_short> *pColor_endpoint_remap;
  vector<unsigned_short> *pColor_selector_remap;
  vector<unsigned_short> *pAlpha_selector_remap;
  long lVar10;
  symbol_codec *pCodec;
  long lVar11;
  int iVar12;
  static_huffman_data_model *this_00;
  uint *puVar13;
  long lVar14;
  symbol_codec codec;
  
  bVar7 = alias_images(this);
  if ((bVar7) && (bVar7 = quantize_images(this), bVar7)) {
    p = (this->m_reference_hist).m_hist.m_p;
    if (p != (uint *)0x0) {
      crnlib_free(p);
      (this->m_reference_hist).m_hist.m_p = (uint *)0x0;
      (this->m_reference_hist).m_hist.m_size = 0;
      (this->m_reference_hist).m_hist.m_capacity = 0;
    }
    this_00 = (static_huffman_data_model *)&this->field_0x1f10;
    lVar10 = 0;
    do {
      pvVar4 = *(void **)((long)&this->m_endpoint_remaping[0].m_p + lVar10);
      if (pvVar4 != (void *)0x0) {
        crnlib_free(pvVar4);
        *(undefined8 *)((long)&this->m_endpoint_remaping[0].m_p + lVar10) = 0;
        *(undefined8 *)((long)&this->m_endpoint_remaping[0].m_size + lVar10) = 0;
      }
      pvVar4 = *(void **)((long)&this->m_endpoint_index_hist[0].m_hist.m_p + lVar10);
      if (pvVar4 != (void *)0x0) {
        crnlib_free(pvVar4);
        *(undefined8 *)((long)&this->m_endpoint_index_hist[0].m_hist.m_p + lVar10) = 0;
        *(undefined8 *)((long)&this->m_endpoint_index_hist[0].m_hist.m_size + lVar10) = 0;
      }
      static_huffman_data_model::clear(this_00);
      pvVar4 = *(void **)((long)&this->m_selector_remaping[0].m_p + lVar10);
      if (pvVar4 != (void *)0x0) {
        crnlib_free(pvVar4);
        *(undefined8 *)((long)&this->m_selector_remaping[0].m_p + lVar10) = 0;
        *(undefined8 *)((long)&this->m_selector_remaping[0].m_size + lVar10) = 0;
      }
      pvVar4 = *(void **)((long)&this->m_selector_index_hist[0].m_hist.m_p + lVar10);
      if (pvVar4 != (void *)0x0) {
        puVar1 = (undefined8 *)((long)&this->m_selector_index_hist[0].m_hist.m_p + lVar10);
        crnlib_free(pvVar4);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      static_huffman_data_model::clear((static_huffman_data_model *)&this_00[3].m_codes);
      lVar10 = lVar10 + 0x10;
      this_00 = this_00 + 1;
    } while (lVar10 == 0x10);
    if (this->m_has_comp[0] != false) {
      optimize_color(this);
    }
    if (this->m_has_comp[1] == true) {
      optimize_alpha(this);
    }
    iVar12 = 0;
    do {
      if ((this->m_levels).m_size != 0) {
        pCodec = &codec;
        if (iVar12 == 0) {
          pCodec = (symbol_codec *)0x0;
        }
        uVar9 = 0;
        puVar13 = &this->m_packed_blocks[0].m_capacity;
        do {
          symbol_codec::symbol_codec(&codec);
          symbol_codec::start_encoding(&codec,0x200000);
          bVar7 = this->m_has_comp[0] != false;
          pColor_endpoint_remap = (vector<unsigned_short> *)0x0;
          if (bVar7) {
            pColor_endpoint_remap = this->m_endpoint_remaping;
          }
          pColor_selector_remap = (vector<unsigned_short> *)0x0;
          if (bVar7) {
            pColor_selector_remap = this->m_selector_remaping;
          }
          bVar7 = this->m_has_comp[1] != false;
          pAlpha_endpoint_remap = (vector<unsigned_short> *)0x0;
          if (bVar7) {
            pAlpha_endpoint_remap = this->m_endpoint_remaping + 1;
          }
          pAlpha_selector_remap = (vector<unsigned_short> *)0x0;
          if (bVar7) {
            pAlpha_selector_remap = this->m_selector_remaping + 1;
          }
          pack_blocks(this,(uint)uVar9,iVar12 == 0 && (uint)uVar9 == 0,pCodec,pColor_endpoint_remap,
                      pColor_selector_remap,pAlpha_endpoint_remap,pAlpha_selector_remap);
          symbol_codec::stop_encoding(&codec,false);
          if (iVar12 != 0) {
            puVar5 = ((vector<unsigned_char> *)(puVar13 + -3))->m_p;
            ((vector<unsigned_char> *)(puVar13 + -3))->m_p = codec.m_output_buf.m_p;
            uVar2 = puVar13[-1];
            puVar13[-1] = codec.m_output_buf.m_size;
            uVar3 = *puVar13;
            *puVar13 = codec.m_output_buf.m_capacity;
            codec.m_output_buf.m_p = puVar5;
            codec.m_output_buf.m_size = uVar2;
            codec.m_output_buf.m_capacity = uVar3;
          }
          if (codec.m_output_syms.m_p != (output_symbol *)0x0) {
            crnlib_free(codec.m_output_syms.m_p);
          }
          if (codec.m_arith_output_buf.m_p != (uchar *)0x0) {
            crnlib_free(codec.m_arith_output_buf.m_p);
          }
          if (codec.m_output_buf.m_p != (uchar *)0x0) {
            crnlib_free(codec.m_output_buf.m_p);
          }
          uVar9 = uVar9 + 1;
          puVar13 = puVar13 + 4;
        } while (uVar9 < (this->m_levels).m_size);
      }
      if (iVar12 == 0) {
        static_huffman_data_model::init(&this->m_reference_dm,(EVP_PKEY_CTX *)0x1);
        lVar14 = 0x1f10;
        lVar11 = 0x1fc0;
        lVar10 = 0;
        do {
          if (*(int *)((long)&this->m_endpoint_index_hist[0].m_hist.m_size + lVar10) != 0) {
            static_huffman_data_model::init
                      ((static_huffman_data_model *)
                       ((long)(this->m_task_pool).m_task_stack.m_stack + lVar14 + -0x10),
                       (EVP_PKEY_CTX *)0x1);
          }
          if (*(int *)((long)&this->m_selector_index_hist[0].m_hist.m_size + lVar10) != 0) {
            static_huffman_data_model::init
                      ((static_huffman_data_model *)
                       ((long)(this->m_task_pool).m_task_stack.m_stack + lVar11 + -0x10),
                       (EVP_PKEY_CTX *)0x1);
          }
          lVar14 = lVar14 + 0x38;
          lVar10 = lVar10 + 0x10;
          lVar11 = lVar11 + 0x38;
        } while (lVar14 == 0x1f48);
      }
      bVar7 = iVar12 == 0;
      iVar12 = iVar12 + 1;
    } while (bVar7);
    bVar7 = pack_data_models(this);
    if (bVar7) {
      create_comp_data(this);
      p_Var6 = this->m_pParams->m_pProgress_func;
      if ((p_Var6 == (crn_progress_callback_func)0x0) ||
         (cVar8 = (*p_Var6)(0x18,0x19,1,1,this->m_pParams->m_pProgress_func_data), cVar8 != 0)) {
        if (-1 < (int)this->m_pParams->m_flags) {
          return true;
        }
        crnlib_print_mem_stats();
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool crn_comp::compress_internal()
    {
        if (!alias_images())
        {
            return false;
        }
        if (!quantize_images())
        {
            return false;
        }

        m_reference_hist.clear();
        for (uint i = 0; i < 2; i++)
        {
            m_endpoint_remaping[i].clear();
            m_endpoint_index_hist[i].clear();
            m_endpoint_index_dm[i].clear();
            m_selector_remaping[i].clear();
            m_selector_index_hist[i].clear();
            m_selector_index_dm[i].clear();
        }

        if (m_has_comp[cColor])
        {
            optimize_color();
        }

        if (m_has_comp[cAlpha0])
        {
            optimize_alpha();
        }

        for (uint pass = 0; pass < 2; pass++)
        {
            for (uint level = 0; level < m_levels.size(); level++)
            {
                symbol_codec codec;
                codec.start_encoding(2 * 1024 * 1024);

                if (!pack_blocks(
                        level,
                        !pass && !level, pass ? &codec : nullptr,
                        m_has_comp[cColor] ? &m_endpoint_remaping[cColor] : nullptr, m_has_comp[cColor] ? &m_selector_remaping[cColor] : nullptr,
                        m_has_comp[cAlpha0] ? &m_endpoint_remaping[cAlpha0] : nullptr, m_has_comp[cAlpha0] ? &m_selector_remaping[cAlpha0] : nullptr))
                {
                    return false;
                }

                codec.stop_encoding(false);

                if (pass)
                {
                    m_packed_blocks[level].swap(codec.get_encoding_buf());
                }
            }

            if (!pass)
            {
                m_reference_dm.init(true, m_reference_hist, 16);

                for (uint i = 0; i < 2; i++)
                {
                    if (m_endpoint_index_hist[i].size())
                    {
                        m_endpoint_index_dm[i].init(true, m_endpoint_index_hist[i], 16);
                    }

                    if (m_selector_index_hist[i].size())
                    {
                        m_selector_index_dm[i].init(true, m_selector_index_hist[i], 16);
                    }
                }
            }
        }

        if (!pack_data_models())
        {
            return false;
        }

        if (!create_comp_data())
        {
            return false;
        }

        if (!update_progress(24, 1, 1))
        {
            return false;
        }

        if (m_pParams->m_flags & cCRNCompFlagDebugging)
        {
            crnlib_print_mem_stats();
        }

        return true;
    }